

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O2

LispPTR N_OP_car(LispPTR tos)

{
  LispPTR *pLVar1;
  uint uVar2;
  
  pLVar1 = NativeAligned4FromLAddr(tos);
  if ((*(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
    uVar2 = *pLVar1;
    if (uVar2 < 0x10000000) {
      pLVar1 = NativeAligned4FromLAddr(uVar2);
      uVar2 = *pLVar1 & 0xfffffff;
    }
    else {
      uVar2 = uVar2 & 0xfffffff;
    }
  }
  else {
    uVar2 = tos;
    if ((tos != 0) && (tos != 0x4c)) {
      MachineState.errorexit = 1;
      uVar2 = 0xffffffff;
      MachineState.tosvalue = tos;
    }
  }
  return uVar2;
}

Assistant:

LispPTR N_OP_car(LispPTR tos) {
  ConsCell *datum68k;
  ConsCell *temp;

  datum68k = (ConsCell *)(NativeAligned4FromLAddr(tos));
  if (Listp(tos)) {
    if (datum68k->cdr_code == CDR_INDIRECT) {
      temp = (ConsCell *)NativeAligned4FromLAddr(datum68k->car_field);
      return ((LispPTR)temp->car_field);
    } else
      return ((LispPTR)datum68k->car_field);
  } else if (tos == NIL_PTR)
    return (tos);
  else if (tos == ATOM_T)
    return (tos);
  else {
    ERROR_EXIT(tos);
  }
}